

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMergeEngineLevel0(SortSubtask *pTask,int nPMA,i64 *piOffset,MergeEngine **ppOut)

{
  PmaReader *pReadr;
  PmaReader *pPVar1;
  int iVar2;
  MergeEngine *pMerger;
  i64 iOff;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  u64 local_60;
  MergeEngine **local_58;
  i64 *local_50;
  ulong local_48;
  SorterFile *local_40;
  SortSubtask *local_38;
  
  iOff = *piOffset;
  local_50 = piOffset;
  pMerger = vdbeMergeEngineNew(nPMA);
  *ppOut = pMerger;
  bVar5 = pMerger != (MergeEngine *)0x0;
  iVar2 = 7;
  if (bVar5) {
    iVar2 = 0;
  }
  local_58 = ppOut;
  if (0 < nPMA && bVar5) {
    local_40 = &pTask->file;
    uVar4 = 1;
    lVar3 = 0;
    local_48 = (ulong)(uint)nPMA;
    local_38 = pTask;
    do {
      pPVar1 = pMerger->aReadr;
      pReadr = (PmaReader *)((long)&pPVar1->iReadOff + lVar3);
      iVar2 = vdbePmaReaderSeek(local_38,pReadr,local_40,iOff);
      if (iVar2 != 0) {
LAB_0014b592:
        iOff = *(i64 *)((long)&pPVar1->iEof + lVar3);
        goto LAB_0014b597;
      }
      local_60 = 0;
      iVar2 = vdbePmaReadVarint(pReadr,&local_60);
      *(u64 *)((long)&pPVar1->iEof + lVar3) = local_60 + *(long *)((long)&pPVar1->iReadOff + lVar3);
      if (iVar2 != 0) goto LAB_0014b592;
      iVar2 = vdbePmaReaderNext(pReadr);
      iOff = *(i64 *)((long)&pPVar1->iEof + lVar3);
      bVar5 = iVar2 == 0;
      if (local_48 <= uVar4) break;
      lVar3 = lVar3 + 0x50;
      uVar4 = uVar4 + 1;
    } while (iVar2 == 0);
  }
  if (!bVar5) {
LAB_0014b597:
    vdbeMergeEngineFree(pMerger);
    *local_58 = (MergeEngine *)0x0;
  }
  *local_50 = iOff;
  return iVar2;
}

Assistant:

static int vdbeMergeEngineLevel0(
  SortSubtask *pTask,             /* Sorter task to read from */
  int nPMA,                       /* Number of PMAs to read */
  i64 *piOffset,                  /* IN/OUT: Readr offset in pTask->file */
  MergeEngine **ppOut             /* OUT: New merge-engine */
){
  MergeEngine *pNew;              /* Merge engine to return */
  i64 iOff = *piOffset;
  int i;
  int rc = SQLITE_OK;

  *ppOut = pNew = vdbeMergeEngineNew(nPMA);
  if( pNew==0 ) rc = SQLITE_NOMEM_BKPT;

  for(i=0; i<nPMA && rc==SQLITE_OK; i++){
    i64 nDummy = 0;
    PmaReader *pReadr = &pNew->aReadr[i];
    rc = vdbePmaReaderInit(pTask, &pTask->file, iOff, pReadr, &nDummy);
    iOff = pReadr->iEof;
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pNew);
    *ppOut = 0;
  }
  *piOffset = iOff;
  return rc;
}